

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_MaxPlayerAmmo(FParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  PClassAmmo *type;
  ulong uVar5;
  AInventory *pAVar6;
  AInventory *this_00;
  
  bVar1 = CheckArgs(this,2);
  if (bVar1) {
    uVar2 = T_GetPlayerNum(this->t_argv);
    if (uVar2 != 0xffffffff) {
      type = T_GetAmmo(this->t_argv + 1);
      if (type != (PClassAmmo *)0x0) {
        uVar5 = (ulong)uVar2;
        if (2 < this->t_argc) {
          pAVar6 = AActor::FindInventory
                             ((AActor *)(&players)[uVar5 * 0x54],(PClassActor *)type,false);
          iVar3 = intvalue(this->t_argv + 2);
          iVar4 = 0;
          if (0 < iVar3) {
            iVar4 = iVar3;
          }
          if (pAVar6 == (AInventory *)0x0) {
            pAVar6 = (AInventory *)Spawn((PClassActor *)type);
            pAVar6->Amount = 0;
            (*(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x29])
                      (pAVar6,(&players)[uVar5 * 0x54]);
          }
          pAVar6->MaxAmount = iVar4;
          this_00 = (AInventory *)(&players)[uVar5 * 0x54];
          do {
            this_00 = GC::ReadBarrier<AInventory>((AInventory **)&(this_00->super_AActor).Inventory)
            ;
            if (this_00 == (AInventory *)0x0) goto LAB_004f40d7;
            bVar1 = DObject::IsKindOf((DObject *)this_00,ABackpackItem::RegistrationInfo.MyClass);
          } while (!bVar1);
          if (this->t_argc < 4) {
            iVar4 = iVar4 * 2;
          }
          else {
            iVar4 = intvalue(this->t_argv + 3);
          }
LAB_004f40d7:
          *(int *)&pAVar6[1].super_AActor.super_DThinker.super_DObject._vptr_DObject = iVar4;
        }
        (this->t_return).type = 1;
        pAVar6 = AActor::FindInventory((AActor *)(&players)[uVar5 * 0x54],(PClassActor *)type,false)
        ;
        if (pAVar6 == (AInventory *)0x0) {
          pAVar6 = (AInventory *)
                   (type->super_PClassInventory).super_PClassActor.super_PClass.Defaults;
        }
        (this->t_return).value.i = pAVar6->MaxAmount;
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_MaxPlayerAmmo()
{
	int playernum, amount;
	PClassAmmo * ammotype;

	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;

		ammotype=T_GetAmmo(t_argv[1]);
		if (!ammotype) return;

		if(t_argc == 2)
		{
		}
		else if(t_argc >= 3)
		{
			AAmmo * iammo = (AAmmo*)players[playernum].mo->FindInventory(ammotype);
			amount = intvalue(t_argv[2]);
			if(amount < 0) amount = 0;
			if (!iammo) 
			{
				iammo = static_cast<AAmmo *>(Spawn (ammotype));
				iammo->Amount = 0;
				iammo->AttachToOwner (players[playernum].mo);
			}
			iammo->MaxAmount = amount;


			for (AInventory *item = players[playernum].mo->Inventory; item != NULL; item = item->Inventory)
			{
				if (item->IsKindOf(RUNTIME_CLASS(ABackpackItem)))
				{
					if (t_argc>=4) amount = intvalue(t_argv[3]);
					else amount*=2;
					break;
				}
			}
			iammo->BackpackMaxAmount=amount;
		}

		t_return.type = svt_int;
		AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
		if (iammo) t_return.value.i = iammo->MaxAmount;
		else t_return.value.i = ((AAmmo*)GetDefaultByType(ammotype))->MaxAmount;
	}
}